

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O1

void __thiscall
btSoftColliders::CollideVF_SS::Process(CollideVF_SS *this,btDbvtNode *lnode,btDbvtNode *lface)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  btVector3 *pbVar3;
  int *piVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  Node *pNVar8;
  Face *pFVar9;
  long lVar10;
  btSoftBody *pbVar11;
  SContact *pSVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  SContact *pSVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar36;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  undefined8 local_108;
  float local_c8;
  
  pNVar8 = (Node *)(lnode->field_2).childs[0];
  pFVar9 = (Face *)(lface->field_2).childs[0];
  fVar38 = (pNVar8->m_x).m_floats[2];
  lVar20 = *(long *)((btVector3 *)pFVar9->m_n)->m_floats;
  lVar21 = *(long *)(((btVector3 *)pFVar9->m_n)->m_floats + 2);
  fVar44 = *(float *)(lVar20 + 0x18) - fVar38;
  fVar49 = *(float *)(lVar21 + 0x18) - fVar38;
  uVar5 = *(undefined8 *)(pNVar8->m_x).m_floats;
  fVar40 = (float)uVar5;
  fVar41 = (float)((ulong)uVar5 >> 0x20);
  uVar5 = *(undefined8 *)(lVar20 + 0x10);
  fVar46 = (float)uVar5 - fVar40;
  fVar48 = (float)((ulong)uVar5 >> 0x20) - fVar41;
  uVar5 = *(undefined8 *)(lVar21 + 0x10);
  fVar51 = (float)uVar5 - fVar40;
  fVar53 = (float)((ulong)uVar5 >> 0x20) - fVar41;
  uVar5 = *(undefined8 *)(*(long *)((btVector3 *)pFVar9->m_n + 1) + 0x10);
  fVar33 = (float)uVar5 - fVar40;
  fVar36 = (float)((ulong)uVar5 >> 0x20) - fVar41;
  fVar29 = *(float *)(*(long *)((btVector3 *)pFVar9->m_n + 1) + 0x18) - fVar38;
  fVar26 = fVar51 - fVar46;
  fVar28 = fVar53 - fVar48;
  fVar32 = fVar49 - fVar44;
  fVar42 = fVar28 * (fVar29 - fVar44) - (fVar36 - fVar48) * fVar32;
  fVar23 = fVar32 * (fVar33 - fVar46) - (fVar29 - fVar44) * fVar26;
  fVar55 = fVar26 * (fVar36 - fVar48) - (fVar33 - fVar46) * fVar28;
  fVar24 = fVar55 * fVar55 + fVar42 * fVar42 + fVar23 * fVar23;
  if (fVar24 <= 1.1920929e-07) {
    fVar27 = 3.4028235e+38;
  }
  else {
    local_108 = CONCAT44(fVar28,fVar26);
    if (fVar24 < 0.0) {
      fVar24 = sqrtf(fVar24);
    }
    else {
      fVar24 = SQRT(fVar24);
    }
    fVar24 = 1.0 / fVar24;
    fVar25 = fVar44 * fVar24 * fVar55 + fVar46 * fVar42 * fVar24 + fVar48 * fVar23 * fVar24;
    fVar27 = 3.4028235e+38;
    if (fVar25 * fVar25 < 3.4028235e+38) {
      fVar27 = fVar42 * fVar24 * fVar25;
      fVar31 = fVar23 * fVar24 * fVar25;
      fVar30 = fVar24 * fVar55 * fVar25;
      fVar24 = fVar46 - fVar27;
      fVar37 = fVar48 - fVar31;
      fVar39 = fVar44 - fVar30;
      fVar43 = fVar51 - fVar27;
      fVar45 = fVar53 - fVar31;
      fVar50 = fVar49 - fVar30;
      if (0.0 < (fVar24 * fVar45 - fVar43 * fVar37) * fVar55 +
                (fVar37 * fVar50 - fVar45 * fVar39) * fVar42 +
                (fVar39 * fVar43 - fVar50 * fVar24) * fVar23) {
        fVar47 = fVar33 - fVar27;
        fVar54 = fVar36 - fVar31;
        fVar52 = fVar29 - fVar30;
        if ((0.0 < (fVar43 * fVar54 - fVar47 * fVar45) * fVar55 +
                   (fVar45 * fVar52 - fVar54 * fVar50) * fVar42 +
                   (fVar50 * fVar47 - fVar52 * fVar43) * fVar23) &&
           (0.0 < (fVar47 * fVar37 - fVar24 * fVar54) * fVar55 +
                  (fVar54 * fVar39 - fVar37 * fVar52) * fVar42 +
                  fVar23 * (fVar52 * fVar24 - fVar39 * fVar47))) {
          local_108 = CONCAT44(fVar31,fVar27);
          fVar27 = fVar25 * fVar25;
          local_c8 = fVar30;
          goto LAB_001ec17b;
        }
      }
      fVar23 = fVar32 * fVar32 + fVar26 * fVar26 + fVar28 * fVar28;
      if (fVar23 <= 1.1920929e-07) {
        fVar27 = 3.4028235e+38;
      }
      else {
        fVar23 = -(fVar44 * fVar32 + fVar46 * fVar26 + fVar48 * fVar28) / fVar23;
        fVar24 = 1.0;
        if (fVar23 <= 1.0) {
          fVar24 = fVar23;
        }
        fVar24 = (float)(~-(uint)(fVar23 < 0.0) & (uint)fVar24);
        fVar26 = fVar26 * fVar24 + fVar46;
        fVar28 = fVar28 * fVar24 + fVar48;
        fVar23 = fVar24 * fVar32 + fVar44;
        local_108 = CONCAT44(fVar28,fVar26);
        fVar24 = fVar23 * fVar23 + fVar26 * fVar26 + fVar28 * fVar28;
        fVar27 = 3.4028235e+38;
        if (fVar24 < 3.4028235e+38) {
          fVar27 = fVar24;
          local_c8 = fVar23;
        }
      }
      fVar24 = fVar33 - fVar51;
      fVar26 = fVar36 - fVar53;
      fVar28 = fVar29 - fVar49;
      fVar23 = fVar28 * fVar28 + fVar24 * fVar24 + fVar26 * fVar26;
      if (1.1920929e-07 < fVar23) {
        fVar23 = -(fVar49 * fVar28 + fVar24 * fVar51 + fVar26 * fVar53) / fVar23;
        fVar32 = 1.0;
        if (fVar23 <= 1.0) {
          fVar32 = fVar23;
        }
        fVar32 = (float)(~-(uint)(fVar23 < 0.0) & (uint)fVar32);
        fVar51 = fVar32 * fVar24 + fVar51;
        fVar53 = fVar32 * fVar26 + fVar53;
        fVar49 = fVar32 * fVar28 + fVar49;
        fVar23 = fVar49 * fVar49 + fVar51 * fVar51 + fVar53 * fVar53;
        if (fVar23 < fVar27) {
          local_108 = CONCAT44(fVar53,fVar51);
          fVar27 = fVar23;
          local_c8 = fVar49;
        }
      }
      fVar46 = fVar46 - fVar33;
      fVar48 = fVar48 - fVar36;
      fVar44 = fVar44 - fVar29;
      fVar23 = fVar44 * fVar44 + fVar46 * fVar46 + fVar48 * fVar48;
      if (1.1920929e-07 < fVar23) {
        fVar23 = -(fVar29 * fVar44 + fVar33 * fVar46 + fVar36 * fVar48) / fVar23;
        fVar24 = 1.0;
        if (fVar23 <= 1.0) {
          fVar24 = fVar23;
        }
        fVar24 = (float)(~-(uint)(fVar23 < 0.0) & (uint)fVar24);
        fVar33 = fVar33 + fVar24 * fVar46;
        fVar36 = fVar36 + fVar24 * fVar48;
        fVar29 = fVar24 * fVar44 + fVar29;
        fVar23 = fVar29 * fVar29 + fVar33 * fVar33 + fVar36 * fVar36;
        if (fVar23 < fVar27) {
          local_108 = CONCAT44(fVar36,fVar33);
          fVar27 = fVar23;
          local_c8 = fVar29;
        }
      }
    }
  }
LAB_001ec17b:
  fVar23 = this->mrg;
  fVar29 = fVar41 - *(float *)((long)(pNVar8->m_q).m_floats + 4);
  fVar51 = fVar40 - (pNVar8->m_q).m_floats[0];
  fVar24 = fVar38 - *(float *)((long)(pNVar8->m_q).m_floats + 8);
  fVar24 = fVar24 * fVar24 + fVar51 * fVar51 + fVar29 * fVar29;
  if (fVar24 < 0.0) {
    fVar24 = sqrtf(fVar24);
  }
  else {
    fVar24 = SQRT(fVar24);
  }
  fVar23 = fVar24 + fVar24 + fVar23;
  if (fVar27 < fVar23 * fVar23) {
    lVar20 = *(long *)((btVector3 *)pFVar9->m_n)->m_floats;
    lVar21 = *(long *)(((btVector3 *)pFVar9->m_n)->m_floats + 2);
    lVar10 = *(long *)((btVector3 *)pFVar9->m_n + 1);
    fVar40 = fVar40 + (float)local_108;
    fVar41 = fVar41 + local_108._4_4_;
    fVar38 = fVar38 + local_c8;
    fVar29 = *(float *)(lVar20 + 0x10) - fVar40;
    fVar53 = *(float *)(lVar20 + 0x14) - fVar41;
    fVar51 = *(float *)(lVar20 + 0x18) - fVar38;
    fVar28 = *(float *)(lVar21 + 0x10) - fVar40;
    fVar24 = *(float *)(lVar21 + 0x14) - fVar41;
    fVar49 = *(float *)(lVar21 + 0x18) - fVar38;
    fVar26 = fVar53 * fVar49 - fVar24 * fVar51;
    fVar51 = fVar51 * fVar28 - fVar49 * fVar29;
    fVar24 = fVar24 * fVar29 - fVar28 * fVar53;
    fVar24 = fVar24 * fVar24 + fVar26 * fVar26 + fVar51 * fVar51;
    if (fVar24 < 0.0) {
      fVar24 = sqrtf(fVar24);
    }
    else {
      fVar24 = SQRT(fVar24);
    }
    fVar53 = *(float *)(lVar21 + 0x10) - fVar40;
    fVar26 = *(float *)(lVar21 + 0x14) - fVar41;
    fVar29 = *(float *)(lVar21 + 0x18) - fVar38;
    fVar49 = *(float *)(lVar10 + 0x10) - fVar40;
    fVar51 = *(float *)(lVar10 + 0x14) - fVar41;
    fVar32 = *(float *)(lVar10 + 0x18) - fVar38;
    fVar28 = fVar26 * fVar32 - fVar51 * fVar29;
    fVar29 = fVar29 * fVar49 - fVar32 * fVar53;
    fVar51 = fVar51 * fVar53 - fVar49 * fVar26;
    fVar51 = fVar51 * fVar51 + fVar28 * fVar28 + fVar29 * fVar29;
    if (fVar51 < 0.0) {
      fVar51 = sqrtf(fVar51);
    }
    else {
      fVar51 = SQRT(fVar51);
    }
    fVar53 = *(float *)(lVar10 + 0x10) - fVar40;
    fVar26 = *(float *)(lVar10 + 0x14) - fVar41;
    fVar29 = *(float *)(lVar10 + 0x18) - fVar38;
    fVar40 = *(float *)(lVar20 + 0x10) - fVar40;
    fVar41 = *(float *)(lVar20 + 0x14) - fVar41;
    fVar38 = *(float *)(lVar20 + 0x18) - fVar38;
    fVar28 = fVar26 * fVar38 - fVar41 * fVar29;
    fVar29 = fVar29 * fVar40 - fVar38 * fVar53;
    fVar38 = fVar41 * fVar53 - fVar40 * fVar26;
    fVar38 = fVar38 * fVar38 + fVar28 * fVar28 + fVar29 * fVar29;
    if (fVar38 < 0.0) {
      fVar38 = sqrtf(fVar38);
    }
    else {
      fVar38 = SQRT(fVar38);
    }
    fVar41 = 1.0 / (fVar24 + fVar51 + fVar38);
    fVar29 = (&pNVar8->m_v)[3].m_floats[0];
    if (0.0 < *(float *)(lVar21 + 0x60) && 0.0 < *(float *)(lVar20 + 0x60)) {
      fVar53 = (float)(-(uint)(0.0 < *(float *)(lVar10 + 0x60)) &
                      (uint)(*(float *)(lVar10 + 0x60) * fVar41 * fVar24 +
                            *(float *)(lVar20 + 0x60) * fVar51 * fVar41 +
                            *(float *)(lVar21 + 0x60) * fVar38 * fVar41));
    }
    else {
      fVar53 = 0.0;
    }
    fVar40 = fVar29 + fVar53;
    if (0.0 < fVar40) {
      if (fVar27 < 0.0) {
        fVar27 = sqrtf(fVar27);
      }
      else {
        fVar27 = SQRT(fVar27);
      }
      fVar27 = -1.0 / fVar27;
      pbVar11 = this->psb[0];
      fVar26 = (pbVar11->m_cfg).kDF;
      fVar28 = (this->psb[1]->m_cfg).kDF;
      if (fVar26 <= fVar28) {
        fVar26 = fVar28;
      }
      auVar34._4_4_ = fVar53;
      auVar34._0_4_ = fVar29;
      auVar34._8_8_ = 0;
      auVar35._4_4_ = fVar40;
      auVar35._0_4_ = fVar40;
      auVar35._8_4_ = fVar40;
      auVar35._12_4_ = fVar40;
      auVar35 = divps(auVar34,auVar35);
      fVar29 = (this->psb[1]->m_cfg).kSHR;
      fVar53 = (pbVar11->m_cfg).kSHR;
      iVar6 = (pbVar11->m_scontacts).m_size;
      iVar7 = (pbVar11->m_scontacts).m_capacity;
      if (iVar6 == iVar7) {
        iVar22 = 1;
        if (iVar6 != 0) {
          iVar22 = iVar6 * 2;
        }
        if (iVar7 < iVar22) {
          if (iVar22 == 0) {
            pSVar19 = (SContact *)0x0;
          }
          else {
            pSVar19 = (SContact *)btAlignedAllocInternal((long)iVar22 << 6,0x10);
          }
          lVar20 = (long)(pbVar11->m_scontacts).m_size;
          if (0 < lVar20) {
            lVar21 = 0;
            do {
              pSVar12 = (pbVar11->m_scontacts).m_data;
              puVar1 = (undefined8 *)
                       ((long)&((SContact *)(&pSVar12->m_weights + -1))->m_node + lVar21);
              uVar5 = *puVar1;
              uVar13 = puVar1[1];
              puVar1 = (undefined8 *)((long)(pSVar12->m_weights).m_floats + lVar21);
              uVar14 = *puVar1;
              uVar15 = puVar1[1];
              puVar1 = (undefined8 *)((long)(pSVar12->m_normal).m_floats + lVar21);
              uVar16 = *puVar1;
              uVar17 = puVar1[1];
              puVar1 = (undefined8 *)((long)pSVar12->m_cfm + lVar21 + -8);
              uVar18 = puVar1[1];
              puVar2 = (undefined8 *)((long)pSVar19->m_cfm + lVar21 + -8);
              *puVar2 = *puVar1;
              puVar2[1] = uVar18;
              puVar1 = (undefined8 *)((long)(pSVar19->m_normal).m_floats + lVar21);
              *puVar1 = uVar16;
              puVar1[1] = uVar17;
              puVar1 = (undefined8 *)((long)(pSVar19->m_weights).m_floats + lVar21);
              *puVar1 = uVar14;
              puVar1[1] = uVar15;
              puVar1 = (undefined8 *)
                       ((long)&((SContact *)(&pSVar19->m_weights + -1))->m_node + lVar21);
              *puVar1 = uVar5;
              puVar1[1] = uVar13;
              lVar21 = lVar21 + 0x40;
            } while (lVar20 * 0x40 != lVar21);
          }
          pSVar12 = (pbVar11->m_scontacts).m_data;
          if (pSVar12 != (SContact *)0x0) {
            if ((pbVar11->m_scontacts).m_ownsMemory == true) {
              btAlignedFreeInternal(pSVar12);
            }
            (pbVar11->m_scontacts).m_data = (SContact *)0x0;
          }
          (pbVar11->m_scontacts).m_ownsMemory = true;
          (pbVar11->m_scontacts).m_data = pSVar19;
          (pbVar11->m_scontacts).m_capacity = iVar22;
        }
      }
      pSVar19 = (pbVar11->m_scontacts).m_data;
      iVar6 = (pbVar11->m_scontacts).m_size;
      pSVar19[iVar6].m_node = pNVar8;
      pSVar19[iVar6].m_face = pFVar9;
      pbVar3 = &pSVar19[iVar6].m_weights;
      pbVar3->m_floats[0] = fVar51 * fVar41;
      pbVar3->m_floats[1] = fVar38 * fVar41;
      pbVar3->m_floats[2] = fVar41 * fVar24;
      pbVar3->m_floats[3] = 0.0;
      pbVar3 = &pSVar19[iVar6].m_normal;
      pbVar3->m_floats[0] = (float)local_108 * fVar27;
      pbVar3->m_floats[1] = local_108._4_4_ * fVar27;
      pbVar3->m_floats[2] = local_c8 * fVar27;
      pbVar3->m_floats[3] = 0.0;
      pSVar19[iVar6].m_margin = fVar23;
      pSVar19[iVar6].m_friction = fVar26;
      *(ulong *)pSVar19[iVar6].m_cfm = CONCAT44(fVar29 * auVar35._4_4_,fVar53 * auVar35._0_4_);
      piVar4 = &(pbVar11->m_scontacts).m_size;
      *piVar4 = *piVar4 + 1;
    }
  }
  return;
}

Assistant:

void		Process(const btDbvtNode* lnode,
			const btDbvtNode* lface)
		{
			btSoftBody::Node*	node=(btSoftBody::Node*)lnode->data;
			btSoftBody::Face*	face=(btSoftBody::Face*)lface->data;
			btVector3			o=node->m_x;
			btVector3			p;
			btScalar			d=SIMD_INFINITY;
			ProjectOrigin(	face->m_n[0]->m_x-o,
				face->m_n[1]->m_x-o,
				face->m_n[2]->m_x-o,
				p,d);
			const btScalar	m=mrg+(o-node->m_q).length()*2;
			if(d<(m*m))
			{
				const btSoftBody::Node*	n[]={face->m_n[0],face->m_n[1],face->m_n[2]};
				const btVector3			w=BaryCoord(n[0]->m_x,n[1]->m_x,n[2]->m_x,p+o);
				const btScalar			ma=node->m_im;
				btScalar				mb=BaryEval(n[0]->m_im,n[1]->m_im,n[2]->m_im,w);
				if(	(n[0]->m_im<=0)||
					(n[1]->m_im<=0)||
					(n[2]->m_im<=0))
				{
					mb=0;
				}
				const btScalar	ms=ma+mb;
				if(ms>0)
				{
					btSoftBody::SContact	c;
					c.m_normal		=	p/-btSqrt(d);
					c.m_margin		=	m;
					c.m_node		=	node;
					c.m_face		=	face;
					c.m_weights		=	w;
					c.m_friction	=	btMax(psb[0]->m_cfg.kDF,psb[1]->m_cfg.kDF);
					c.m_cfm[0]		=	ma/ms*psb[0]->m_cfg.kSHR;
					c.m_cfm[1]		=	mb/ms*psb[1]->m_cfg.kSHR;
					psb[0]->m_scontacts.push_back(c);
				}
			}	
		}